

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::move_into(hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
            *this,node *pNode)

{
  raw_node *prVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  uint uVar10;
  raw_node *prVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar10 = (uint)((int)(pNode->super_value_type).first * -0x61c88647) >>
           ((byte)this->m_hash_shift & 0x1f);
  prVar1 = (this->m_values).m_p;
  prVar11 = prVar1 + uVar10;
  if (prVar1[uVar10].m_bits[9] != '\0') {
    uVar12 = (this->m_values).m_size - 1;
    uVar14 = uVar10;
    do {
      uVar13 = uVar14 - 1;
      if (uVar14 == 0) {
        uVar13 = uVar12;
      }
      if (uVar13 == uVar10) {
        return;
      }
      prVar11 = prVar11 + -1;
      if (uVar14 == 0) {
        prVar11 = prVar1 + uVar12;
      }
      uVar14 = uVar13;
    } while (prVar11->m_bits[9] != '\0');
  }
  uVar2 = (pNode->super_value_type).field_0x8;
  uVar3 = (pNode->super_value_type).field_0x9;
  uVar4 = (pNode->super_value_type).field_0xa;
  uVar5 = (pNode->super_value_type).field_0xb;
  uVar6 = (pNode->super_value_type).field_0xc;
  uVar7 = (pNode->super_value_type).field_0xd;
  uVar8 = (pNode->super_value_type).field_0xe;
  uVar9 = (pNode->super_value_type).field_0xf;
  *(unsigned_long_long *)prVar11->m_bits = (pNode->super_value_type).first;
  prVar11->m_bits[8] = uVar2;
  prVar11->m_bits[9] = uVar3;
  prVar11->m_bits[10] = uVar4;
  prVar11->m_bits[0xb] = uVar5;
  prVar11->m_bits[0xc] = uVar6;
  prVar11->m_bits[0xd] = uVar7;
  prVar11->m_bits[0xe] = uVar8;
  prVar11->m_bits[0xf] = uVar9;
  (pNode->super_value_type).field_0x9 = 0;
  this->m_num_valid = this->m_num_valid + 1;
  return;
}

Assistant:

inline int hash_key(const Key& k) const
        {
            CRNLIB_ASSERT((1U << (32U - m_hash_shift)) == m_values.size());

            uint hash = static_cast<uint>(m_hasher(k));

            // Fibonacci hashing
            hash = (2654435769U * hash) >> m_hash_shift;

            CRNLIB_ASSERT(hash < m_values.size());
            return hash;
        }